

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::rayTestSingleInternal::RayTester::ProcessLeaf(RayTester *this,int i)

{
  cbtCompoundShapeChild *pcVar1;
  cbtCollisionShape *pcVar2;
  cbtCollisionObjectWrapper tmpOb;
  cbtTransform childWorldTrans;
  cbtCollisionObjectWrapper local_c0;
  RayResultCallback local_98;
  RayResultCallback *local_70;
  int local_68;
  cbtTransform local_60;
  
  pcVar1 = (this->m_compoundShape->m_children).m_data;
  pcVar2 = pcVar1[i].m_childShape;
  cbtTransform::operator*(&local_60,this->m_colObjWorldTransform,&pcVar1[i].m_transform);
  local_c0.m_collisionObject = this->m_collisionObject;
  local_c0.m_parent = (cbtCollisionObjectWrapper *)0x0;
  local_c0.m_partId = -1;
  local_70 = this->m_resultCallback;
  local_98.m_collisionObject = (cbtCollisionObject *)0x0;
  local_98.m_collisionFilterGroup = 1;
  local_98.m_collisionFilterMask = -1;
  local_98._vptr_RayResultCallback = (_func_int **)&PTR__RayResultCallback_01193e28;
  local_98.m_closestHitFraction = local_70->m_closestHitFraction;
  local_98.m_flags = local_70->m_flags;
  local_c0.m_shape = pcVar2;
  local_c0.m_worldTransform = &local_60;
  local_c0.m_index = i;
  local_68 = i;
  rayTestSingleInternal(this->m_rayFromTrans,this->m_rayToTrans,&local_c0,&local_98);
  return;
}

Assistant:

void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}